

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.hpp
# Opt level: O2

IPipelineResourceSignature * __thiscall
Diligent::SerializedResourceSignatureImpl::GetDeviceSignature
          (SerializedResourceSignatureImpl *this,DeviceType Type)

{
  _Tuple_impl<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
  _Var1;
  IPipelineResourceSignature *pIVar2;
  char (*in_RCX) [40];
  string msg;
  
  if (WebGPU < Type) {
    FormatString<char[26],char[40]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"static_cast<Uint32>(Type) < DeviceCount",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetDeviceSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/include/SerializedResourceSignatureImpl.hpp"
               ,0x7b);
    std::__cxx11::string::~string((string *)&msg);
  }
  _Var1.super__Head_base<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_false>.
  _M_head_impl = (this->m_pDeviceSignatures)._M_elems[Type]._M_t.
                 super___uniq_ptr_impl<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
                 .
                 super__Head_base<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_false>
  ;
  if (_Var1.super__Head_base<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_false>
      ._M_head_impl == (PRSWapperBase *)0x0) {
    pIVar2 = (IPipelineResourceSignature *)0x0;
  }
  else {
    pIVar2 = (IPipelineResourceSignature *)
             (**(code **)(*(long *)_Var1.
                                   super__Head_base<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_false>
                                   ._M_head_impl + 0x10))();
  }
  return pIVar2;
}

Assistant:

IPipelineResourceSignature* GetDeviceSignature(DeviceType Type) const
    {
        VERIFY_EXPR(static_cast<Uint32>(Type) < DeviceCount);
        const auto& Wrpr = m_pDeviceSignatures[static_cast<size_t>(Type)];
        return Wrpr ? Wrpr->GetPRS() : nullptr;
    }